

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void G_WriteSnapshots(FILE *file)

{
  uint uVar1;
  FPNGChunkArchive *this;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  SBYTE cnum;
  FPNGChunkArchive arc3;
  
  lVar2 = 0;
  uVar1 = wadlevelinfos.Count;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    if (*(long *)((long)&(wadlevelinfos.Array)->snapshot + lVar2) != 0) {
      FPNGChunkArchive::FPNGChunkArchive(&arc3,file,0x70416e73);
      writeSnapShot(&arc3.super_FArchive,
                    (level_info_t *)((long)&(wadlevelinfos.Array)->levelnum + lVar2));
      FPNGChunkArchive::~FPNGChunkArchive(&arc3);
      uVar1 = wadlevelinfos.Count;
    }
    lVar2 = lVar2 + 0x1b0;
  }
  if (TheDefaultLevelInfo.snapshot != (FCompressedMemFile *)0x0) {
    FPNGChunkArchive::FPNGChunkArchive(&arc3,file,0x704e7364);
    writeSnapShot(&arc3.super_FArchive,&TheDefaultLevelInfo);
    FPNGChunkArchive::~FPNGChunkArchive(&arc3);
    uVar1 = wadlevelinfos.Count;
  }
  lVar2 = 100;
  this = (FPNGChunkArchive *)0x0;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    if (*(int *)((long)&(wadlevelinfos.Array)->levelnum + lVar2) < 0) {
      if (this == (FPNGChunkArchive *)0x0) {
        this = (FPNGChunkArchive *)operator_new(0x300);
        FPNGChunkArchive::FPNGChunkArchive(this,file,0x74536976);
      }
      FArchive::operator<<
                (&this->super_FArchive,(FString *)((long)wadlevelinfos.Array + lVar2 + -0x5c));
      uVar1 = wadlevelinfos.Count;
    }
    lVar2 = lVar2 + 0x1b0;
  }
  if (this != (FPNGChunkArchive *)0x0) {
    FString::FString((FString *)&arc3,(char *)"");
    FArchive::operator<<(&this->super_FArchive,(FString *)&arc3);
    (*(this->super_FArchive)._vptr_FArchive[1])(this);
    FString::~FString((FString *)&arc3);
  }
  if (multiplayer == true) {
    FPNGChunkArchive::FPNGChunkArchive(&arc3,file,0x734c6372);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      cnum = (SBYTE)SinglePlayerClass[lVar2];
      FArchive::operator<<(&arc3.super_FArchive,(BYTE *)&cnum);
    }
    FPNGChunkArchive::~FPNGChunkArchive(&arc3);
  }
  FPNGChunkArchive::FPNGChunkArchive(&arc3,file,0x734c6370);
  puVar4 = &DAT_009ba470;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    if (playeringame[lVar2] == true) {
      cnum = (SBYTE)lVar2;
      FArchive::operator<<(&arc3.super_FArchive,(BYTE *)&cnum);
      FArchive::UserWriteClass(&arc3.super_FArchive,(PClass *)*puVar4);
    }
    cnum = -1;
    FArchive::operator<<(&arc3.super_FArchive,(BYTE *)&cnum);
    puVar4 = puVar4 + 0x54;
  }
  FPNGChunkArchive::~FPNGChunkArchive(&arc3);
  return;
}

Assistant:

void G_WriteSnapshots (FILE *file)
{
	unsigned int i;

	for (i = 0; i < wadlevelinfos.Size(); i++)
	{
		if (wadlevelinfos[i].snapshot)
		{
			FPNGChunkArchive arc (file, SNAP_ID);
			writeSnapShot (arc, (level_info_t *)&wadlevelinfos[i]);
		}
	}
	if (TheDefaultLevelInfo.snapshot != NULL)
	{
		FPNGChunkArchive arc (file, DSNP_ID);
		writeSnapShot(arc, &TheDefaultLevelInfo);
	}

	FPNGChunkArchive *arc = NULL;
	
	// Write out which levels have been visited
	for (i = 0; i < wadlevelinfos.Size(); ++i)
	{
		if (wadlevelinfos[i].flags & LEVEL_VISITED)
		{
			if (arc == NULL)
			{
				arc = new FPNGChunkArchive (file, VIST_ID);
			}
			(*arc) << wadlevelinfos[i].MapName;
		}
	}

	if (arc != NULL)
	{
		FString empty = "";
		(*arc) << empty;
		delete arc;
	}

	// Store player classes to be used when spawning a random class
	if (multiplayer)
	{
		FPNGChunkArchive arc2 (file, RCLS_ID);
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			SBYTE cnum = SinglePlayerClass[i];
			arc2 << cnum;
		}
	}

	// Store player classes that are currently in use
	FPNGChunkArchive arc3 (file, PCLS_ID);
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		BYTE pnum;
		if (playeringame[i])
		{
			pnum = i;
			arc3 << pnum;
			arc3.UserWriteClass (players[i].cls);
		}
		pnum = 255;
		arc3 << pnum;
	}
}